

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphAdjacencyList.h
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<cmGraphEdge*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (cmGraphEdge *__result,cmGraphEdge *__a,cmGraphEdge *__b,cmGraphEdge *__c)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  cmGraphEdge *__b_00;
  
  uVar1 = __a->Dest;
  uVar2 = __b->Dest;
  uVar3 = __c->Dest;
  if (uVar1 < uVar2) {
    __b_00 = __b;
    if ((uVar3 <= uVar2) && (__b_00 = __a, uVar1 < uVar3)) {
      __b_00 = __c;
    }
  }
  else {
    __b_00 = __a;
    if ((uVar3 <= uVar1) && (__b_00 = __b, uVar2 < uVar3)) {
      __b_00 = __c;
    }
  }
  swap<cmGraphEdge>(__result,__b_00);
  return;
}

Assistant:

operator size_t() const { return this->Dest; }